

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::replaceSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  size_t sVar1;
  Iface *pIVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined4 in_register_0000000c;
  Replacer<kj::Directory> *extraout_RDX;
  Replacer<kj::Directory> *extraout_RDX_00;
  Replacer<kj::Directory> *pRVar7;
  char *pcVar8;
  WriteMode in_R8D;
  size_t *this_00;
  PathPtr finalName;
  Own<kj::Directory::Replacer<kj::Directory>,_std::nullptr_t> OVar9;
  Fault f;
  String temp;
  mode_t acl;
  OwnFd local_a4;
  Fault local_a0;
  String local_98;
  Function<int_(kj::StringPtr)> local_78;
  String local_68;
  undefined4 local_44;
  PathPtr local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  local_44 = 0x1c0;
  if ((in_R8D & PRIVATE) == 0) {
    local_44 = 0x1ff;
  }
  local_40.parts.ptr = finalName.parts.ptr;
  local_40.parts.size_ = finalName.parts.size_;
  local_78.impl.ptr = (Iface *)operator_new(0x18);
  (local_78.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00262ab0;
  local_78.impl.ptr[1]._vptr_Iface = (_func_int **)this_00;
  local_78.impl.ptr[2]._vptr_Iface = (_func_int **)&local_44;
  local_78.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceSubdir(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary(&local_98,(DiskHandle *)this_00,finalName,in_R8D,&local_78);
  pIVar2 = local_78.impl.ptr;
  if (local_78.impl.ptr != (Iface *)0x0) {
    local_78.impl.ptr = (Iface *)0x0;
    (**(local_78.impl.disposer)->_vptr_Disposer)
              (local_78.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  do {
    pcVar8 = "";
    if (local_98.content.size_ != 0) {
      pcVar8 = local_98.content.ptr;
    }
    iVar3 = openat64((int)*this_00,pcVar8,0x90000);
    if (-1 < iVar3) goto LAB_001efe83;
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_a0.exception = (Exception *)0x0;
    local_68.content.ptr = (char *)0x0;
    local_68.content.size_ = 0;
    _::Debug::Fault::init
              (&local_a0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal(&local_a0);
  }
LAB_001efe83:
  local_a0.exception._0_4_ = 0xffffffff;
  local_a4.fd = iVar3;
  puVar5 = (undefined8 *)operator_new(0x10);
  *(int *)(puVar5 + 1) = iVar3;
  local_a4.fd = -1;
  *puVar5 = &PTR_getFd_00262808;
  PathPtr::toString(&local_68,&local_40,false);
  puVar6 = (undefined8 *)operator_new(0x60);
  *(WriteMode *)(puVar6 + 1) = in_R8D;
  *puVar6 = &PTR_get_00262b18;
  puVar6[2] = &_::HeapDisposer<kj::(anonymous_namespace)::DiskDirectory>::instance;
  puVar6[3] = puVar5;
  puVar6[4] = this_00;
  puVar6[5] = local_98.content.ptr;
  puVar6[6] = local_98.content.size_;
  puVar6[7] = local_98.content.disposer;
  local_98.content.ptr = (char *)0x0;
  local_98.content.size_ = 0;
  puVar6[8] = local_68.content.ptr;
  puVar6[9] = local_68.content.size_;
  puVar6[10] = local_68.content.disposer;
  *(undefined1 *)(puVar6 + 0xb) = 0;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)
       &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::Directory>>::
        instance;
  *(undefined8 **)&this->super_DiskHandle = puVar6;
  OwnFd::~OwnFd(&local_a4);
  OwnFd::~OwnFd((OwnFd *)&local_a0);
  sVar1 = local_98.content.size_;
  pcVar8 = local_98.content.ptr;
  pRVar7 = extraout_RDX;
  if (local_98.content.ptr != (char *)0x0) {
    local_98.content.ptr = (char *)0x0;
    local_98.content.size_ = 0;
    (**(local_98.content.disposer)->_vptr_ArrayDisposer)
              (local_98.content.disposer,pcVar8,1,sVar1,sVar1,0);
    pRVar7 = extraout_RDX_00;
  }
  OVar9.ptr = pRVar7;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

Own<Replacer<Directory>> replaceSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceSubdir(path, mode);
  }